

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GRULayerParams::SerializeWithCachedSizes
          (GRULayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  uint64 uVar3;
  ActivationParams *value;
  uint local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  GRULayerParams *this_local;
  
  uVar3 = inputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = inputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar3,output);
  }
  uVar3 = outputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = outputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar3,output);
  }
  local_20 = 0;
  uVar2 = activations_size(this);
  for (; local_20 < uVar2; local_20 = local_20 + 1) {
    value = activations(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(10,&value->super_MessageLite,output);
  }
  bVar1 = sequenceoutput(this);
  if (bVar1) {
    bVar1 = sequenceoutput(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0xf,bVar1,output);
  }
  bVar1 = hasbiasvectors(this);
  if (bVar1) {
    bVar1 = hasbiasvectors(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x14,bVar1,output);
  }
  bVar1 = has_updategateweightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1e,&this->updategateweightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_resetgateweightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&this->resetgateweightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_outputgateweightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x20,&this->outputgateweightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_updategaterecursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x32,&this->updategaterecursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_resetgaterecursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x33,&this->resetgaterecursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_outputgaterecursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x34,&this->outputgaterecursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_updategatebiasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x46,&this->updategatebiasvector_->super_MessageLite,output);
  }
  bVar1 = has_resetgatebiasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x47,&this->resetgatebiasvector_->super_MessageLite,output);
  }
  bVar1 = has_outputgatebiasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x48,&this->outputgatebiasvector_->super_MessageLite,output);
  }
  bVar1 = reverseinput(this);
  if (bVar1) {
    bVar1 = reverseinput(this);
    google::protobuf::internal::WireFormatLite::WriteBool(100,bVar1,output);
  }
  return;
}

Assistant:

void GRULayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GRULayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputvectorsize(), output);
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputvectorsize(), output);
  }

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  for (unsigned int i = 0, n = this->activations_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->activations(i), output);
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(15, this->sequenceoutput(), output);
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(20, this->hasbiasvectors(), output);
  }

  // .CoreML.Specification.WeightParams updateGateWeightMatrix = 30;
  if (this->has_updategateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      30, *this->updategateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams resetGateWeightMatrix = 31;
  if (this->has_resetgateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *this->resetgateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams outputGateWeightMatrix = 32;
  if (this->has_outputgateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      32, *this->outputgateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams updateGateRecursionMatrix = 50;
  if (this->has_updategaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, *this->updategaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams resetGateRecursionMatrix = 51;
  if (this->has_resetgaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      51, *this->resetgaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 52;
  if (this->has_outputgaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      52, *this->outputgaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams updateGateBiasVector = 70;
  if (this->has_updategatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      70, *this->updategatebiasvector_, output);
  }

  // .CoreML.Specification.WeightParams resetGateBiasVector = 71;
  if (this->has_resetgatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      71, *this->resetgatebiasvector_, output);
  }

  // .CoreML.Specification.WeightParams outputGateBiasVector = 72;
  if (this->has_outputgatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      72, *this->outputgatebiasvector_, output);
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(100, this->reverseinput(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GRULayerParams)
}